

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
Chainstate::MaybeUpdateMempoolForReorg
          (Chainstate *this,DisconnectedBlockTransactions *disconnectpool,bool fAddToMempool)

{
  _List_node_base *p_Var1;
  CTxMemPool *pool;
  undefined8 uVar2;
  function<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>)>
  check_final_and_mature;
  ResultType RVar3;
  bool bVar4;
  int64_t accept_time;
  CCoinsViewCache *coins_cache;
  _List_node_base *__return_storage_ptr__;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe88;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  queuedTx;
  vector<uint256,_std::allocator<uint256>_> vHashUpdate;
  MempoolAcceptResult local_118;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_mempool != (CTxMemPool *)0x0) {
    vHashUpdate.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vHashUpdate.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vHashUpdate.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__ = (_List_node_base *)&queuedTx;
    DisconnectedBlockTransactions::take_abi_cxx11_
              ((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)__return_storage_ptr__,disconnectpool);
    for (; __return_storage_ptr__ !=
           queuedTx.
           super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
        __return_storage_ptr__ = __return_storage_ptr__->_M_prev) {
      if (fAddToMempool) {
        bVar4 = CTransaction::IsCoinBase((CTransaction *)__return_storage_ptr__->_M_prev[1]._M_next)
        ;
        if (bVar4) goto LAB_008b3808;
        p_Var1 = __return_storage_ptr__->_M_prev;
        accept_time = GetTime();
        AcceptToMemoryPool(&local_118,this,(CTransactionRef *)(p_Var1 + 1),accept_time,true,false);
        RVar3 = local_118.m_result_type;
        MempoolAcceptResult::~MempoolAcceptResult(&local_118);
        if (RVar3 != VALID) goto LAB_008b3808;
        p_Var1 = __return_storage_ptr__->_M_prev[1]._M_next;
        uVar2 = *(undefined8 *)((long)&p_Var1[3]._M_prev + 1);
        local_118.m_state.super_ValidationState<TxValidationResult>._1_8_ =
             *(undefined8 *)((long)&p_Var1[4]._M_next + 1);
        local_118.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._1_8_ =
             *(undefined8 *)((long)&p_Var1[4]._M_prev + 1);
        local_118.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._9_8_ =
             *(undefined8 *)((long)&p_Var1[5]._M_next + 1);
        local_118.m_result_type._1_3_ = (undefined3)uVar2;
        local_118.m_result_type = (uint)(uint3)local_118.m_result_type._1_3_ << 8;
        local_118._4_5_ = SUB85((ulong)uVar2 >> 0x18,0);
        bVar4 = CTxMemPool::exists(this->m_mempool,(GenTxid *)&local_118);
        if (bVar4) {
          std::vector<uint256,_std::allocator<uint256>_>::push_back
                    (&vHashUpdate,
                     (value_type *)
                     ((long)&__return_storage_ptr__->_M_prev[1]._M_next[3]._M_prev + 1));
        }
      }
      else {
LAB_008b3808:
        CTxMemPool::removeRecursive
                  (this->m_mempool,(CTransaction *)__return_storage_ptr__->_M_prev[1]._M_next,REORG)
        ;
      }
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(&queuedTx.
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              );
    CTxMemPool::UpdateTransactionsFromBlock(this->m_mempool,&vHashUpdate);
    check_final_and_mature.super__Function_base._M_functor._8_8_ = this;
    check_final_and_mature.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffffe88;
    check_final_and_mature.super__Function_base._M_manager = (_Manager_type)0x0;
    check_final_and_mature._M_invoker =
         std::
         _Function_handler<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp:343:42)>
         ::_M_manager;
    CTxMemPool::removeForReorg(this->m_mempool,&this->m_chain,check_final_and_mature);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe90);
    pool = this->m_mempool;
    coins_cache = CoinsTip(this);
    LimitMempoolSize(pool,coins_cache);
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              (&vHashUpdate.super__Vector_base<uint256,_std::allocator<uint256>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::MaybeUpdateMempoolForReorg(
    DisconnectedBlockTransactions& disconnectpool,
    bool fAddToMempool)
{
    if (!m_mempool) return;

    AssertLockHeld(cs_main);
    AssertLockHeld(m_mempool->cs);
    std::vector<uint256> vHashUpdate;
    {
        // disconnectpool is ordered so that the front is the most recently-confirmed
        // transaction (the last tx of the block at the tip) in the disconnected chain.
        // Iterate disconnectpool in reverse, so that we add transactions
        // back to the mempool starting with the earliest transaction that had
        // been previously seen in a block.
        const auto queuedTx = disconnectpool.take();
        auto it = queuedTx.rbegin();
        while (it != queuedTx.rend()) {
            // ignore validation errors in resurrected transactions
            if (!fAddToMempool || (*it)->IsCoinBase() ||
                AcceptToMemoryPool(*this, *it, GetTime(),
                    /*bypass_limits=*/true, /*test_accept=*/false).m_result_type !=
                        MempoolAcceptResult::ResultType::VALID) {
                // If the transaction doesn't make it in to the mempool, remove any
                // transactions that depend on it (which would now be orphans).
                m_mempool->removeRecursive(**it, MemPoolRemovalReason::REORG);
            } else if (m_mempool->exists(GenTxid::Txid((*it)->GetHash()))) {
                vHashUpdate.push_back((*it)->GetHash());
            }
            ++it;
        }
    }

    // AcceptToMemoryPool/addUnchecked all assume that new mempool entries have
    // no in-mempool children, which is generally not true when adding
    // previously-confirmed transactions back to the mempool.
    // UpdateTransactionsFromBlock finds descendants of any transactions in
    // the disconnectpool that were added back and cleans up the mempool state.
    m_mempool->UpdateTransactionsFromBlock(vHashUpdate);

    // Predicate to use for filtering transactions in removeForReorg.
    // Checks whether the transaction is still final and, if it spends a coinbase output, mature.
    // Also updates valid entries' cached LockPoints if needed.
    // If false, the tx is still valid and its lockpoints are updated.
    // If true, the tx would be invalid in the next block; remove this entry and all of its descendants.
    // Note that TRUC rules are not applied here, so reorgs may cause violations of TRUC inheritance or
    // topology restrictions.
    const auto filter_final_and_mature = [&](CTxMemPool::txiter it)
        EXCLUSIVE_LOCKS_REQUIRED(m_mempool->cs, ::cs_main) {
        AssertLockHeld(m_mempool->cs);
        AssertLockHeld(::cs_main);
        const CTransaction& tx = it->GetTx();

        // The transaction must be final.
        if (!CheckFinalTxAtTip(*Assert(m_chain.Tip()), tx)) return true;

        const LockPoints& lp = it->GetLockPoints();
        // CheckSequenceLocksAtTip checks if the transaction will be final in the next block to be
        // created on top of the new chain.
        if (TestLockPointValidity(m_chain, lp)) {
            if (!CheckSequenceLocksAtTip(m_chain.Tip(), lp)) {
                return true;
            }
        } else {
            const CCoinsViewMemPool view_mempool{&CoinsTip(), *m_mempool};
            const std::optional<LockPoints> new_lock_points{CalculateLockPointsAtTip(m_chain.Tip(), view_mempool, tx)};
            if (new_lock_points.has_value() && CheckSequenceLocksAtTip(m_chain.Tip(), *new_lock_points)) {
                // Now update the mempool entry lockpoints as well.
                it->UpdateLockPoints(*new_lock_points);
            } else {
                return true;
            }
        }

        // If the transaction spends any coinbase outputs, it must be mature.
        if (it->GetSpendsCoinbase()) {
            for (const CTxIn& txin : tx.vin) {
                if (m_mempool->exists(GenTxid::Txid(txin.prevout.hash))) continue;
                const Coin& coin{CoinsTip().AccessCoin(txin.prevout)};
                assert(!coin.IsSpent());
                const auto mempool_spend_height{m_chain.Tip()->nHeight + 1};
                if (coin.IsCoinBase() && mempool_spend_height - coin.nHeight < COINBASE_MATURITY) {
                    return true;
                }
            }
        }
        // Transaction is still valid and cached LockPoints are updated.
        return false;
    }